

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

void av1_update_level_info(AV1_COMP *cpi,size_t size,int64_t ts_start,int64_t ts_end)

{
  int iVar1;
  int iVar2;
  int temporal_layer_id_00;
  long lVar3;
  long lVar4;
  AV1LevelStats *level_stats_00;
  long lVar5;
  long lVar6;
  int tiles_00;
  int pic_size;
  int iVar7;
  int *buffer_00;
  int64_t in_RCX;
  int64_t in_RDX;
  size_t in_RSI;
  long *in_RDI;
  double dVar8;
  undefined1 auVar9 [16];
  int target_level_minor;
  int target_level_major;
  TARGET_LEVEL_FAIL_ID fail_id;
  int tier;
  AV1_LEVEL target_level;
  AV1_LEVEL level;
  DECODER_MODEL *decoder_models;
  int encoded_frames_in_last_second;
  FrameWindowBuffer *buffer;
  AV1LevelSpec *level_spec;
  AV1LevelStats *level_stats;
  AV1LevelInfo *level_info;
  int i;
  int is_still_picture;
  BITSTREAM_PROFILE profile;
  SequenceHeader *seq_params;
  int spatial_layer_id;
  int temporal_layer_id;
  double compression_ratio;
  int tile_width_is_valid;
  int max_superres_tile_width;
  int min_cropped_tile_height;
  int min_cropped_tile_width;
  int max_tile_size;
  int show_existing_frame;
  int show_frame;
  int frame_header_count;
  int luma_pic_size;
  int tiles;
  int tile_rows;
  int tile_cols;
  int height;
  int width;
  int upscaled_width;
  AV1LevelParams *level_params;
  AV1_COMMON *cm;
  int local_118;
  int local_114;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  double local_100;
  int local_f4;
  int local_f0;
  int local_ec;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  uint in_stack_ffffffffffffff24;
  uint in_stack_ffffffffffffff28;
  TARGET_LEVEL_FAIL_ID in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined2 in_stack_ffffffffffffff34;
  undefined1 in_stack_ffffffffffffff36;
  byte bVar10;
  undefined1 in_stack_ffffffffffffff37;
  byte level_00;
  TileDataEnc *in_stack_ffffffffffffff38;
  AV1LevelInfo *level_info_00;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  int *in_stack_ffffffffffffff50;
  AV1LevelSpec *level_spec_00;
  int local_94;
  uint in_stack_ffffffffffffff94;
  int local_68;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  int show_existing_frame_00;
  int show_frame_00;
  int frame_header_count_00;
  
  lVar3 = *in_RDI;
  lVar5 = in_RDI[0x77f7];
  iVar1 = *(int *)((long)in_RDI + 0x3bfbc);
  iVar2 = (int)in_RDI[0x8404];
  tiles_00 = iVar2 * *(int *)((long)in_RDI + 0x42024);
  pic_size = (int)in_RDI[0x77f9] * iVar1;
  frame_header_count_00 = (int)in_RDI[0x13a60];
  show_frame_00 = (int)in_RDI[0x782c];
  show_existing_frame_00 = (int)in_RDI[0x782d];
  get_tile_stats((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff38,
                 (int *)CONCAT17(in_stack_ffffffffffffff37,
                                 CONCAT16(in_stack_ffffffffffffff36,
                                          CONCAT24(in_stack_ffffffffffffff34,
                                                   in_stack_ffffffffffffff30))),
                 (int *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                 (int *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 (int *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                 in_stack_ffffffffffffff50);
  dVar8 = av1_get_compression_ratio((AV1_COMMON *)(in_RDI + 0x77f0),in_RSI);
  temporal_layer_id_00 = *(int *)((long)in_RDI + 0x4230c);
  lVar6 = in_RDI[0x8462];
  lVar4 = in_RDI[0x8401];
  for (local_94 = 0; local_94 < *(int *)(lVar4 + 0x70) + 1; local_94 = local_94 + 1) {
    iVar7 = is_in_operating_point
                      (*(int *)(lVar4 + 0x74 + (long)local_94 * 4),temporal_layer_id_00,(int)lVar6);
    if ((iVar7 != 0) && ((*(uint *)(lVar3 + 0x5ab0) >> ((byte)local_94 & 0x1f) & 1) != 0)) {
      level_stats_00 = *(AV1LevelStats **)(lVar3 + 0x5ab8 + (long)local_94 * 8);
      iVar7 = in_stack_ffffffffffffffa4;
      if (in_stack_ffffffffffffffa4 < level_stats_00->max_tile_size) {
        iVar7 = level_stats_00->max_tile_size;
      }
      level_stats_00->max_tile_size = iVar7;
      iVar7 = local_68;
      if (local_68 < level_stats_00->max_superres_tile_width) {
        iVar7 = level_stats_00->max_superres_tile_width;
      }
      level_stats_00->max_superres_tile_width = iVar7;
      iVar7 = in_stack_ffffffffffffffa0;
      if (level_stats_00->min_cropped_tile_width < in_stack_ffffffffffffffa0) {
        iVar7 = level_stats_00->min_cropped_tile_width;
      }
      level_stats_00->min_cropped_tile_width = iVar7;
      local_ec = in_stack_ffffffffffffff9c;
      if (level_stats_00->min_cropped_tile_height < in_stack_ffffffffffffff9c) {
        local_ec = level_stats_00->min_cropped_tile_height;
      }
      level_stats_00->min_cropped_tile_height = local_ec;
      level_stats_00->tile_width_is_valid =
           in_stack_ffffffffffffff94 & level_stats_00->tile_width_is_valid;
      local_f0 = (int)lVar5;
      if (level_stats_00->min_frame_width < (int)lVar5) {
        local_f0 = level_stats_00->min_frame_width;
      }
      level_stats_00->min_frame_width = local_f0;
      local_f4 = iVar1;
      if (level_stats_00->min_frame_height < iVar1) {
        local_f4 = level_stats_00->min_frame_height;
      }
      level_stats_00->min_frame_height = local_f4;
      local_100 = dVar8;
      if (level_stats_00->min_cr < dVar8) {
        local_100 = level_stats_00->min_cr;
      }
      level_stats_00->min_cr = local_100;
      auVar9._8_4_ = (int)(in_RSI >> 0x20);
      auVar9._0_8_ = in_RSI;
      auVar9._12_4_ = 0x45300000;
      level_stats_00->total_compressed_size =
           (auVar9._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)in_RSI) - 4503599627370496.0) +
           level_stats_00->total_compressed_size;
      level_spec_00 = (AV1LevelSpec *)(level_stats_00 + 1);
      local_104 = pic_size;
      if (pic_size < level_stats_00[1].max_tile_size) {
        local_104 = level_stats_00[1].max_tile_size;
      }
      level_stats_00[1].max_tile_size = local_104;
      if ((int)in_RDI[0x77f9] < level_stats_00[1].max_superres_tile_width) {
        local_108 = level_stats_00[1].max_superres_tile_width;
      }
      else {
        local_108 = (int)in_RDI[0x77f9];
      }
      level_stats_00[1].max_superres_tile_width = local_108;
      local_10c = iVar1;
      if (iVar1 < level_stats_00[1].min_cropped_tile_width) {
        local_10c = level_stats_00[1].min_cropped_tile_width;
      }
      level_stats_00[1].min_cropped_tile_width = local_10c;
      local_110 = iVar2;
      if (iVar2 < level_stats_00[1].min_frame_height) {
        local_110 = level_stats_00[1].min_frame_height;
      }
      level_stats_00[1].min_frame_height = local_110;
      local_114 = tiles_00;
      if (tiles_00 < level_stats_00[1].min_frame_width) {
        local_114 = level_stats_00[1].min_frame_width;
      }
      level_stats_00[1].min_frame_width = local_114;
      buffer_00 = &level_stats_00[2].min_frame_width;
      store_frame_record(in_RDX,in_RCX,in_RSI,pic_size,frame_header_count_00,tiles_00,show_frame_00,
                         show_existing_frame_00,(FrameWindowBuffer *)buffer_00);
      if (show_frame_00 != 0) {
        if (show_frame_00 == 0) {
          local_118 = 0;
        }
        else {
          local_118 = count_frames((FrameWindowBuffer *)buffer_00,10000000);
        }
        scan_past_frames((FrameWindowBuffer *)buffer_00,local_118,level_spec_00,level_stats_00);
        level_stats_00->total_time_encoded =
             (double)(in_RDI[0xc0ec] - in_RDI[0xc0eb]) / 10000000.0 +
             level_stats_00->total_time_encoded;
      }
      level_info_00 = (AV1LevelInfo *)(level_stats_00 + 0xde);
      for (level_00 = 0; level_00 < 0x1c; level_00 = level_00 + 1) {
        decoder_model_process_frame
                  ((AV1_COMP *)CONCAT44(pic_size,frame_header_count_00),
                   CONCAT44(show_frame_00,show_existing_frame_00),
                   (DECODER_MODEL *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      }
      bVar10 = *(byte *)(lVar3 + 0x5a90 + (long)local_94);
      if (((bVar10 < 0x1c) && ((int)in_RDI[0x84f2] != 0)) &&
         (in_stack_ffffffffffffff2c =
               check_level_constraints
                         (level_info_00,level_00,(uint)*(byte *)(lVar4 + 0x141 + (long)local_94),
                          in_stack_ffffffffffffff2c,
                          (BITSTREAM_PROFILE)(in_stack_ffffffffffffff28 >> 0x18),
                          in_stack_ffffffffffffff24), in_stack_ffffffffffffff2c != TARGET_LEVEL_OK))
      {
        in_stack_ffffffffffffff28 = ((int)(uint)bVar10 >> 2) + 2;
        in_stack_ffffffffffffff24 = bVar10 & 3;
        aom_internal_error((aom_internal_error_info *)in_RDI[0x77f6],AOM_CODEC_ERROR,
                           "Failed to encode to the target level %d_%d. %s",
                           (ulong)in_stack_ffffffffffffff28,(ulong)in_stack_ffffffffffffff24,
                           level_fail_messages[in_stack_ffffffffffffff2c]);
      }
    }
  }
  return;
}

Assistant:

void av1_update_level_info(AV1_COMP *cpi, size_t size, int64_t ts_start,
                           int64_t ts_end) {
  AV1_COMMON *const cm = &cpi->common;
  const AV1LevelParams *const level_params = &cpi->ppi->level_params;

  const int upscaled_width = cm->superres_upscaled_width;
  const int width = cm->width;
  const int height = cm->height;
  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;
  const int tiles = tile_cols * tile_rows;
  const int luma_pic_size = upscaled_width * height;
  const int frame_header_count = cpi->frame_header_count;
  const int show_frame = cm->show_frame;
  const int show_existing_frame = cm->show_existing_frame;

  int max_tile_size;
  int min_cropped_tile_width;
  int min_cropped_tile_height;
  int max_superres_tile_width;
  int tile_width_is_valid;
  get_tile_stats(cm, cpi->tile_data, &max_tile_size, &max_superres_tile_width,
                 &min_cropped_tile_width, &min_cropped_tile_height,
                 &tile_width_is_valid);

  const double compression_ratio = av1_get_compression_ratio(cm, size);

  const int temporal_layer_id = cm->temporal_layer_id;
  const int spatial_layer_id = cm->spatial_layer_id;
  const SequenceHeader *const seq_params = cm->seq_params;
  const BITSTREAM_PROFILE profile = seq_params->profile;
  const int is_still_picture = seq_params->still_picture;
  // update level_stats
  // TODO(kyslov@) fix the implementation according to buffer model
  for (int i = 0; i < seq_params->operating_points_cnt_minus_1 + 1; ++i) {
    if (!is_in_operating_point(seq_params->operating_point_idc[i],
                               temporal_layer_id, spatial_layer_id) ||
        !((level_params->keep_level_stats >> i) & 1)) {
      continue;
    }

    AV1LevelInfo *const level_info = level_params->level_info[i];
    assert(level_info != NULL);
    AV1LevelStats *const level_stats = &level_info->level_stats;

    level_stats->max_tile_size =
        AOMMAX(level_stats->max_tile_size, max_tile_size);
    level_stats->max_superres_tile_width =
        AOMMAX(level_stats->max_superres_tile_width, max_superres_tile_width);
    level_stats->min_cropped_tile_width =
        AOMMIN(level_stats->min_cropped_tile_width, min_cropped_tile_width);
    level_stats->min_cropped_tile_height =
        AOMMIN(level_stats->min_cropped_tile_height, min_cropped_tile_height);
    level_stats->tile_width_is_valid &= tile_width_is_valid;
    level_stats->min_frame_width = AOMMIN(level_stats->min_frame_width, width);
    level_stats->min_frame_height =
        AOMMIN(level_stats->min_frame_height, height);
    level_stats->min_cr = AOMMIN(level_stats->min_cr, compression_ratio);
    level_stats->total_compressed_size += (double)size;

    // update level_spec
    // TODO(kyslov@) update all spec fields
    AV1LevelSpec *const level_spec = &level_info->level_spec;
    level_spec->max_picture_size =
        AOMMAX(level_spec->max_picture_size, luma_pic_size);
    level_spec->max_h_size =
        AOMMAX(level_spec->max_h_size, cm->superres_upscaled_width);
    level_spec->max_v_size = AOMMAX(level_spec->max_v_size, height);
    level_spec->max_tile_cols = AOMMAX(level_spec->max_tile_cols, tile_cols);
    level_spec->max_tiles = AOMMAX(level_spec->max_tiles, tiles);

    // Store info. of current frame into FrameWindowBuffer.
    FrameWindowBuffer *const buffer = &level_info->frame_window_buffer;
    store_frame_record(ts_start, ts_end, size, luma_pic_size,
                       frame_header_count, tiles, show_frame,
                       show_existing_frame, buffer);
    if (show_frame) {
      // Count the number of frames encoded in the past 1 second.
      const int encoded_frames_in_last_second =
          show_frame ? count_frames(buffer, TICKS_PER_SEC) : 0;
      scan_past_frames(buffer, encoded_frames_in_last_second, level_spec,
                       level_stats);
      level_stats->total_time_encoded +=
          (cpi->time_stamps.prev_ts_end - cpi->time_stamps.prev_ts_start) /
          (double)TICKS_PER_SEC;
    }

    DECODER_MODEL *const decoder_models = level_info->decoder_models;
    for (AV1_LEVEL level = SEQ_LEVEL_2_0; level < SEQ_LEVELS; ++level) {
      decoder_model_process_frame(cpi, size << 3, &decoder_models[level]);
    }

    // Check whether target level is met.
    const AV1_LEVEL target_level = level_params->target_seq_level_idx[i];
    if (target_level < SEQ_LEVELS && cpi->oxcf.strict_level_conformance) {
      assert(is_valid_seq_level_idx(target_level));
      const int tier = seq_params->tier[i];
      const TARGET_LEVEL_FAIL_ID fail_id = check_level_constraints(
          level_info, target_level, tier, is_still_picture, profile, 0);
      if (fail_id != TARGET_LEVEL_OK) {
        const int target_level_major = 2 + (target_level >> 2);
        const int target_level_minor = target_level & 3;
        aom_internal_error(cm->error, AOM_CODEC_ERROR,
                           "Failed to encode to the target level %d_%d. %s",
                           target_level_major, target_level_minor,
                           level_fail_messages[fail_id]);
      }
    }
  }
}